

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* ear::extraPosVerticalNominal
            (pair<std::vector<ear::Channel,_std::allocator<ear::Channel>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
             *__return_storage_ptr__,Layout *layout)

{
  tuple<double&,double&,double&> *this;
  double dVar1;
  PolarPosition polarPosition;
  anon_class_16_2_86f740a8 __pred;
  bool bVar2;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *pvVar3;
  size_type sVar4;
  size_type cols;
  iterator iVar5;
  iterator iVar6;
  back_insert_iterator<std::vector<ear::Channel,_std::allocator<ear::Channel>_>_> bVar7;
  const_iterator ptVar8;
  string *__val;
  difference_type dVar9;
  Scalar *pSVar10;
  Index IVar11;
  PolarPosition *pPVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined1 auVar13 [16];
  RowXpr local_698;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_660;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_650;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_648;
  int local_63c;
  undefined1 local_638 [4];
  int midChannelIndex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  undefined1 local_608 [8];
  VectorXd downmixRow;
  optional<std::pair<double,_double>_> local_5f0;
  optional<std::pair<double,_double>_> local_5d0;
  PolarPosition local_5b8;
  PolarPosition local_5a0;
  optional<ear::PolarPosition> local_588;
  PolarPosition local_568;
  PolarPosition local_550;
  allocator<char> local_531;
  string local_530;
  Channel local_510;
  PolarPosition local_480;
  reference local_468;
  Channel *midChannel;
  iterator __end2;
  iterator __begin2;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *__range2;
  double epsilon;
  PolarPosition local_428;
  PolarPosition local_410;
  reference local_3f8;
  Channel *channel;
  iterator __end3;
  iterator __begin3;
  vector<ear::Channel,_std::allocator<ear::Channel>_> *__range3;
  double azimuthRange;
  double layerRealElevation;
  double azimuthLimit;
  variant<ear::PolarScreen,_ear::CartesianScreen> local_390;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_360;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_328;
  allocator<char> local_309;
  string local_308;
  undefined1 local_2e8 [8];
  Layout currentLayerLayout;
  tuple<double,_double,_double> *layer;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<std::tuple<double,_double,_double>_> *__range1;
  double layerUpperBound;
  double layerLowerBound;
  double layerNominalElevation;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  tuple<double,_double,_double> local_1f8;
  tuple<double,_double,_double> local_1e0;
  undefined1 local_1c8 [8];
  initializer_list<std::tuple<double,_double,_double>_> layers;
  variant<ear::PolarScreen,_ear::CartesianScreen> local_190;
  optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_> local_160;
  vector<ear::Channel,_std::allocator<ear::Channel>_> local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  Layout midLayerLayout;
  IdentityReturnType local_60;
  undefined1 local_48 [8];
  MatrixXd downmix;
  vector<ear::Channel,_std::allocator<ear::Channel>_> extraChannels;
  Layout *layout_local;
  
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector
            ((vector<ear::Channel,_std::allocator<ear::Channel>_> *)
             &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  pvVar3 = Layout::channels(layout);
  sVar4 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::size(pvVar3);
  pvVar3 = Layout::channels(layout);
  cols = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::size(pvVar3);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_60,sVar4,cols);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_48,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_101);
  local_128.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector(&local_128);
  getDefaultScreen();
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::optional
            (&local_160,&local_190);
  Layout::Layout((Layout *)local_e0,&local_100,&local_128,&local_160);
  boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::~optional(&local_160);
  boost::variant<ear::PolarScreen,_ear::CartesianScreen>::~variant(&local_190);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_128);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pvVar3 = Layout::channels(layout);
  iVar5 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(pvVar3);
  pvVar3 = Layout::channels(layout);
  iVar6 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(pvVar3);
  pvVar3 = Layout::channels((Layout *)local_e0);
  bVar7 = std::back_inserter<std::vector<ear::Channel,std::allocator<ear::Channel>>>(pvVar3);
  layers._M_len =
       (size_type)
       std::
       copy_if<__gnu_cxx::__normal_iterator<ear::Channel*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,std::back_insert_iterator<std::vector<ear::Channel,std::allocator<ear::Channel>>>,ear::extraPosVerticalNominal(ear::Layout)::__0>
                 (iVar5._M_current,iVar6._M_current,bVar7.container);
  local_200 = -30.0;
  local_208 = -70.0;
  local_210 = -10.0;
  std::make_tuple<double,double,double>(&local_1f8,&local_200,&local_208,&local_210);
  local_218 = 30.0;
  local_220 = 10.0;
  layerNominalElevation = 70.0;
  std::make_tuple<double,double,double>(&local_1e0,&local_218,&local_220,&layerNominalElevation);
  local_1c8 = (undefined1  [8])&local_1f8;
  layers._M_array = (iterator)0x2;
  __end1 = std::initializer_list<std::tuple<double,_double,_double>_>::begin
                     ((initializer_list<std::tuple<double,_double,_double>_> *)local_1c8);
  ptVar8 = std::initializer_list<std::tuple<double,_double,_double>_>::end
                     ((initializer_list<std::tuple<double,_double,_double>_> *)local_1c8);
  for (; __end1 != ptVar8; __end1 = __end1 + 1) {
    this = (tuple<double&,double&,double&> *)
           (currentLayerLayout._screen.super_type.m_storage.dummy_.data + 0x28);
    std::tie<double,double,double>
              ((tuple<double_&,_double_&,_double_&> *)this,&layerLowerBound,&layerUpperBound,
               (double *)&__range1);
    std::tuple<double&,double&,double&>::operator=(this,__end1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"",&local_309);
    local_328.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::vector(&local_328);
    getDefaultScreen();
    boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::optional
              (&local_360,&local_390);
    Layout::Layout((Layout *)local_2e8,&local_308,&local_328,&local_360);
    boost::optional<boost::variant<ear::PolarScreen,_ear::CartesianScreen>_>::~optional(&local_360);
    boost::variant<ear::PolarScreen,_ear::CartesianScreen>::~variant(&local_390);
    std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector(&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    std::allocator<char>::~allocator(&local_309);
    pvVar3 = Layout::channels(layout);
    iVar5 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(pvVar3);
    pvVar3 = Layout::channels(layout);
    iVar6 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(pvVar3);
    pvVar3 = Layout::channels((Layout *)local_2e8);
    bVar7 = std::back_inserter<std::vector<ear::Channel,std::allocator<ear::Channel>>>(pvVar3);
    __pred.layerUpperBound = (double *)&__range1;
    __pred.layerLowerBound = &layerUpperBound;
    std::
    copy_if<__gnu_cxx::__normal_iterator<ear::Channel*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,std::back_insert_iterator<std::vector<ear::Channel,std::allocator<ear::Channel>>>,ear::extraPosVerticalNominal(ear::Layout)::__1>
              ((__normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                )iVar5._M_current,
               (__normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                )iVar6._M_current,bVar7,__pred);
    layerRealElevation = 0.0;
    pvVar3 = Layout::channels((Layout *)local_2e8);
    sVar4 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::size(pvVar3);
    if (sVar4 == 0) {
      azimuthRange = layerLowerBound;
    }
    else {
      __range3 = (vector<ear::Channel,_std::allocator<ear::Channel>_> *)
                 std::numeric_limits<double>::min();
      pvVar3 = Layout::channels((Layout *)local_2e8);
      __end3 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(pvVar3);
      channel = (Channel *)std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(pvVar3);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                                    *)&channel);
        if (!bVar2) break;
        local_3f8 = __gnu_cxx::
                    __normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                    ::operator*(&__end3);
        pPVar12 = &local_410;
        Channel::polarPositionNominal(pPVar12,local_3f8);
        std::abs((int)pPVar12);
        if ((double)__range3 < (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)) {
          pPVar12 = &local_428;
          Channel::polarPositionNominal(pPVar12,local_3f8);
          std::abs((int)pPVar12);
          __range3 = (vector<ear::Channel,_std::allocator<ear::Channel>_> *)
                     CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        }
        __gnu_cxx::
        __normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
        ::operator++(&__end3);
      }
      layerRealElevation = (double)__range3 + 40.0;
      pvVar3 = Layout::channels((Layout *)local_2e8);
      iVar5 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(pvVar3);
      pvVar3 = Layout::channels((Layout *)local_2e8);
      iVar6 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(pvVar3);
      dVar1 = std::
              accumulate<__gnu_cxx::__normal_iterator<ear::Channel*,std::vector<ear::Channel,std::allocator<ear::Channel>>>,double,ear::extraPosVerticalNominal(ear::Layout)::__2>
                        (0,iVar5._M_current,iVar6._M_current);
      pvVar3 = Layout::channels((Layout *)local_2e8);
      sVar4 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::size(pvVar3);
      auVar13._8_4_ = (int)(sVar4 >> 0x20);
      auVar13._0_8_ = sVar4;
      auVar13._12_4_ = 0x45300000;
      azimuthRange = dVar1 / ((auVar13._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
    }
    pvVar3 = Layout::channels((Layout *)local_e0);
    __end2 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::begin(pvVar3);
    midChannel = (Channel *)std::vector<ear::Channel,_std::allocator<ear::Channel>_>::end(pvVar3);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                                  *)&midChannel);
      if (!bVar2) break;
      local_468 = __gnu_cxx::
                  __normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
                  ::operator*(&__end2);
      pPVar12 = &local_480;
      Channel::polarPosition(pPVar12,local_468);
      std::abs((int)pPVar12);
      if (layerRealElevation - 1e-05 <= (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"extra",&local_531);
        Channel::polarPosition(&local_568,local_468);
        PolarPosition::PolarPosition(&local_550,local_568.azimuth,azimuthRange,1.0);
        Channel::polarPositionNominal(&local_5b8,local_468);
        PolarPosition::PolarPosition(&local_5a0,local_5b8.azimuth,layerLowerBound,1.0);
        boost::optional<ear::PolarPosition>::optional(&local_588,&local_5a0);
        boost::optional<std::pair<double,_double>_>::optional();
        boost::optional<std::pair<double,_double>_>::optional();
        polarPosition.elevation = local_550.elevation;
        polarPosition.azimuth = local_550.azimuth;
        polarPosition.distance = local_550.distance;
        Channel::Channel(&local_510,&local_530,polarPosition,&local_588,&local_5d0,&local_5f0,false)
        ;
        std::vector<ear::Channel,_std::allocator<ear::Channel>_>::push_back
                  ((vector<ear::Channel,_std::allocator<ear::Channel>_> *)
                   &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_cols,&local_510);
        Channel::~Channel(&local_510);
        boost::optional<std::pair<double,_double>_>::~optional(&local_5f0);
        boost::optional<std::pair<double,_double>_>::~optional(&local_5d0);
        boost::optional<ear::PolarPosition>::~optional(&local_588);
        std::__cxx11::string::~string((string *)&local_530);
        std::allocator<char>::~allocator(&local_531);
        pvVar3 = Layout::channels(layout);
        sVar4 = std::vector<ear::Channel,_std::allocator<ear::Channel>_>::size(pvVar3);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
                  ((ConstantReturnType *)
                   &names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,sVar4);
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_608,
                   (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
        Layout::channelNames_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_638,layout);
        local_648._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_638);
        local_658._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_638);
        local_660._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_638);
        __val = Channel::name_abi_cxx11_(local_468);
        local_650 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    std::
                    find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                              (local_658,local_660,__val);
        dVar9 = std::
                distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          (local_648,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            )local_650);
        local_63c = (int)dVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_608
                             ,(long)local_63c);
        *pSVar10 = 1.0;
        IVar11 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::conservativeResize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,IVar11 + 1
                   ,NoChange);
        IVar11 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                           ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                  (&local_698,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_48,
                   IVar11 + -1);
        Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                  ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_698,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_608);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_638);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
                  ((Matrix<double,__1,_1,_0,__1,_1> *)local_608);
      }
      __gnu_cxx::
      __normal_iterator<ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>::
      operator++(&__end2);
    }
    Layout::~Layout((Layout *)local_2e8);
  }
  std::
  make_pair<std::vector<ear::Channel,std::allocator<ear::Channel>>&,Eigen::Matrix<double,_1,_1,0,_1,_1>&>
            (__return_storage_ptr__,
             (vector<ear::Channel,_std::allocator<ear::Channel>_> *)
             &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  Layout::~Layout((Layout *)local_e0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_48);
  std::vector<ear::Channel,_std::allocator<ear::Channel>_>::~vector
            ((vector<ear::Channel,_std::allocator<ear::Channel>_> *)
             &downmix.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<Channel>, Eigen::MatrixXd> extraPosVerticalNominal(
      Layout layout) {
    std::vector<Channel> extraChannels;
    Eigen::MatrixXd downmix = Eigen::MatrixXd::Identity(
        layout.channels().size(), layout.channels().size());

    Layout midLayerLayout;
    std::copy_if(layout.channels().begin(), layout.channels().end(),
                 std::back_inserter(midLayerLayout.channels()), [](Channel c) {
                   return -10 <= c.polarPositionNominal().elevation &&
                          c.polarPositionNominal().elevation <= 10;
                 });

    auto layers = {std::make_tuple(-30.0, -70.0, -10.0),
                   std::make_tuple(30.0, 10.0, 70.0)};

    double layerNominalElevation, layerLowerBound, layerUpperBound;
    for (const auto& layer : layers) {
      std::tie(layerNominalElevation, layerLowerBound, layerUpperBound) = layer;

      Layout currentLayerLayout;
      std::copy_if(
          layout.channels().begin(), layout.channels().end(),
          std::back_inserter(currentLayerLayout.channels()), [&](Channel c) {
            return layerLowerBound <= c.polarPositionNominal().elevation &&
                   c.polarPositionNominal().elevation <= layerUpperBound;
          });

      // for each loudspeaker in the mid layer that has an azimuth greater
      // than az_limit, add a virtual speaker directly above/below it at the
      // elevation of the current layer, which is downmixed directly to the
      // mid layer loudspeaker. az_limit is set to the range of azimuths in
      // the current layer, with some space added to prevent fast vertical
      // source movements when sources move horizontally. If there are no
      // channels on this layer then a copy of all mid layer speakers is
      // made.
      double azimuthLimit = 0.0;
      double layerRealElevation = 0.0;
      if (currentLayerLayout.channels().size() != 0) {
        double azimuthRange = std::numeric_limits<double>::min();
        for (const auto& channel : currentLayerLayout.channels()) {
          if (azimuthRange < std::abs(channel.polarPositionNominal().azimuth)) {
            azimuthRange = std::abs(channel.polarPositionNominal().azimuth);
          }
        }
        azimuthLimit = azimuthRange + 40.0;
        layerRealElevation =
            std::accumulate(currentLayerLayout.channels().begin(),
                            currentLayerLayout.channels().end(), 0.0,
                            [&](double sum, const Channel& c) -> double {
                              return sum + c.polarPosition().elevation;
                            }) /
            static_cast<double>(currentLayerLayout.channels().size());
      } else {
        layerRealElevation = layerNominalElevation;
      }

      double epsilon = 1e-5;
      for (const auto& midChannel : midLayerLayout.channels()) {
        if (std::abs(midChannel.polarPosition().azimuth) >=
            azimuthLimit - epsilon) {
          extraChannels.push_back(Channel(
              "extra",
              PolarPosition(midChannel.polarPosition().azimuth,
                            layerRealElevation, 1.0),
              PolarPosition(midChannel.polarPositionNominal().azimuth,
                            layerNominalElevation, 1.0)

                  ));
          Eigen::VectorXd downmixRow =
              Eigen::VectorXd::Zero(layout.channels().size());
          auto names = layout.channelNames();
          int midChannelIndex = static_cast<int>(std::distance(
              names.begin(),
              std::find(names.begin(), names.end(), midChannel.name())));
          downmixRow(midChannelIndex) = 1.0;
          downmix.conservativeResize(downmix.rows() + 1, Eigen::NoChange);
          downmix.row(downmix.rows() - 1) = downmixRow;
        }
      }
    }
    return std::make_pair(extraChannels, downmix);
  }